

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_java_validator(t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  ostream *poVar2;
  pointer pptVar3;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"public void validate() throws TException {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar2 = std::operator<<(out,(string *)&local_b0);
  poVar2 = std::operator<<(poVar2,"// check for required fields");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  for (pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    if ((*pptVar3)->req_ == T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
      poVar2 = std::operator<<(out,(string *)&local_b0);
      poVar2 = std::operator<<(poVar2,"if (!");
      generate_isset_check_abi_cxx11_(&local_50,this,*pptVar3);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2,") {");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_90);
      poVar2 = std::operator<<(poVar2,"  throw new TProtocolException(\"Required field \'");
      poVar2 = std::operator<<(poVar2,(string *)&(*pptVar3)->name_);
      poVar2 = std::operator<<(poVar2,"\' is unset! Struct:\" + toString());");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
      poVar2 = std::operator<<(poVar2,(string *)&local_70);
      poVar2 = std::operator<<(poVar2,"}");
      poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_java_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "public void validate() throws TException {" << endl;
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out << indent() << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      out << indent() << "if (!" << generate_isset_check(*f_iter) << ") {" << endl << indent()
          << "  throw new TProtocolException(\"Required field '" << (*f_iter)->get_name()
          << "' is unset! Struct:\" + toString());" << endl << indent() << "}" << endl << endl;
    }
  }

  indent_down();
  indent(out) << "}" << endl << endl;
}